

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_io_reinit_iter_fn(event_base *base,int fd,evmap_io *ctx,void *arg)

{
  eventop *peVar1;
  size_t __n;
  event *peVar2;
  ushort uVar3;
  int iVar4;
  ushort uVar5;
  bool bVar6;
  
  if (ctx != (evmap_io *)0x0) {
    bVar6 = ctx->nread != 0;
    peVar1 = base->evsel;
    uVar3 = bVar6 + 4 + (ushort)bVar6;
    if (ctx->nwrite == 0) {
      uVar3 = (ushort)bVar6 * 2;
    }
    uVar5 = uVar3 + 0x80;
    if (ctx->nclose == 0) {
      uVar5 = uVar3;
    }
    __n = peVar1->fdinfo_len;
    if (__n != 0) {
      memset(ctx + 1,0,__n);
    }
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      peVar2 = (ctx->events).lh_first;
      if (peVar2 != (event *)0x0) {
        uVar5 = uVar5 | peVar2->ev_events & 0x20U;
      }
    }
    iVar4 = (*peVar1->add)(base,fd,0,uVar5,ctx + 1);
    if (iVar4 == -1) {
      *(undefined4 *)arg = 0xffffffff;
    }
    return 0;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
             ,0x267,"ctx","evmap_io_reinit_iter_fn");
}

Assistant:

static int
evmap_io_reinit_iter_fn(struct event_base *base, evutil_socket_t fd,
    struct evmap_io *ctx, void *arg)
{
	const struct eventop *evsel = base->evsel;
	void *extra;
	int *result = arg;
	short events = 0;
	struct event *ev;
	EVUTIL_ASSERT(ctx);

	extra = ((char*)ctx) + sizeof(struct evmap_io);
	if (ctx->nread)
		events |= EV_READ;
	if (ctx->nwrite)
		events |= EV_WRITE;
	if (ctx->nclose)
		events |= EV_CLOSED;
	if (evsel->fdinfo_len)
		memset(extra, 0, evsel->fdinfo_len);
	if (events &&
	    (ev = LIST_FIRST(&ctx->events)) &&
	    (ev->ev_events & EV_ET))
		events |= EV_ET;
	if (evsel->add(base, fd, 0, events, extra) == -1)
		*result = -1;

	return 0;
}